

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O1

int detect_form(archive_read *a,int *is_form_d)

{
  byte bVar1;
  size_t sVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  byte *b;
  size_t len;
  void *pvVar6;
  ssize_t sVar7;
  long lVar8;
  size_t sVar9;
  byte *pbVar10;
  byte *pbVar11;
  ulong uVar12;
  byte *pbVar13;
  ulong uVar14;
  size_t sVar15;
  bool bVar16;
  bool bVar17;
  ssize_t avail;
  ssize_t nl;
  int local_5c;
  size_t local_58;
  ulong local_50;
  int local_44;
  ulong local_40;
  int *local_38;
  
  if (is_form_d != (int *)0x0) {
    *is_form_d = 0;
  }
  b = (byte *)__archive_read_ahead(a,1,(ssize_t *)&local_58);
  if (b == (byte *)0x0) {
    iVar3 = -1;
  }
  else {
    local_50 = 0;
    local_5c = 0;
    local_44 = 0;
    sVar15 = local_58;
    local_38 = is_form_d;
LAB_004f1f31:
    if (local_58 == 0) {
      local_40 = 0;
      len = 0;
    }
    else {
      len = get_line_size((char *)b,local_58,(ssize_t *)&local_40);
    }
    if ((local_40 == 0) && (len == local_58)) {
      bVar16 = false;
      do {
        sVar9 = local_58;
        uVar14 = (ulong)((int)sVar15 + 0x3ffU & 0xfffffc00);
        pvVar6 = __archive_read_ahead(a,uVar14 << (uVar14 < sVar15 + 0xa0),(ssize_t *)&local_58);
        if (pvVar6 == (void *)0x0) {
          if ((long)sVar15 < (long)local_58) {
            pvVar6 = __archive_read_ahead(a,local_58,(ssize_t *)&local_58);
            bVar16 = true;
            goto LAB_004f1fc7;
          }
          bVar17 = false;
          b = (byte *)0x0;
        }
        else {
LAB_004f1fc7:
          sVar2 = local_58;
          b = (byte *)((long)pvVar6 + (sVar15 - sVar9));
          local_58 = local_58 - (sVar15 - sVar9);
          sVar7 = get_line_size((char *)b,local_58,(ssize_t *)&local_40);
          if (sVar7 < 0) {
            len = 0;
          }
          len = len + sVar7;
          bVar17 = true;
          sVar15 = sVar2;
        }
        if (!bVar17) {
          len = 0;
          break;
        }
        if (((local_40 != 0) || (len != local_58)) || (bVar16)) break;
      } while( true );
    }
    uVar14 = local_40;
    if ((0 < (long)len) && (local_40 != 0)) {
      if (local_5c == 0) {
        bVar16 = 0 < (long)len;
        if (0 < (long)len) {
          pbVar13 = b + len;
          do {
            sVar9 = local_58 - 1;
            if ((*b != 0x20) && (*b != 9)) goto LAB_004f2089;
            b = b + 1;
            bVar16 = 1 < (long)len;
            bVar17 = 1 < (long)len;
            len = len - 1;
            local_58 = sVar9;
          } while (bVar17);
          len = 0;
          b = pbVar13;
        }
LAB_004f2089:
        bVar1 = *b;
        if (bVar1 < 0x23) {
          if ((bVar1 == 10) || (bVar1 == 0xd)) {
LAB_004f20a5:
            b = b + len;
            local_58 = local_58 - len;
            goto LAB_004f1f31;
          }
LAB_004f2161:
          bVar17 = true;
          sVar9 = len;
          pbVar13 = b;
          if (bVar16) {
            lVar8 = 0;
            do {
              uVar12 = (ulong)b[lVar8];
              if ((uVar12 < 0x21) && ((0x100002600U >> (uVar12 & 0x3f) & 1) != 0)) {
                pbVar13 = b + lVar8;
                goto LAB_004f2206;
              }
              if (bid_entry_safe_char[uVar12] == '\0') {
                lVar8 = 0;
                goto LAB_004f2206;
              }
              pbVar13 = pbVar13 + 1;
              lVar8 = lVar8 + 1;
              bVar16 = 1 < (long)sVar9;
              sVar9 = sVar9 - 1;
            } while (bVar16);
            lVar8 = 1;
            sVar9 = 0;
            pbVar13 = b + len;
LAB_004f2206:
            bVar17 = (int)lVar8 == 0;
          }
          iVar3 = 0;
          if (bVar17) {
            pbVar11 = b + -local_40 + len;
            if (((b + -local_40 + len + -2 < b) || (pbVar11[-1] != 0x5c)) ||
               ((bVar1 = b[-local_40 + len + -2], bVar1 != 9 && (bVar1 != 0x20)))) {
              pbVar10 = pbVar11 + -1;
              bVar16 = true;
              if (pbVar10 < b) {
                uVar4 = 0;
LAB_004f225f:
                if ((uVar4 == 0) || (bVar16)) goto LAB_004f2304;
                iVar3 = 0;
                bVar17 = false;
                if (*pbVar11 != 0x2f) {
                  sVar9 = len - (uVar4 + local_40);
                  bVar17 = true;
                  iVar3 = 1;
                  pbVar13 = b;
                }
              }
              else {
                bVar17 = false;
                if (*pbVar10 != 0x5c) {
                  uVar4 = 0;
                  if (b <= pbVar10) {
                    bVar16 = false;
                    uVar4 = 0;
                    do {
                      bVar1 = *pbVar10;
                      if ((bVar1 == 9) || (bVar1 == 0x20)) break;
                      if (bid_entry_safe_char[bVar1] == '\0') goto LAB_004f2304;
                      uVar4 = uVar4 + 1;
                      if (bVar1 == 0x2f) {
                        bVar16 = true;
                      }
                      pbVar10 = pbVar10 + -1;
                    } while (b <= pbVar10);
                    pbVar11 = pbVar10 + 1;
                    bVar16 = !bVar16;
                  }
                  goto LAB_004f225f;
                }
                iVar3 = 0;
              }
            }
            else {
LAB_004f2304:
              iVar3 = 0;
              bVar17 = false;
            }
            iVar5 = -1;
            if (bVar17) goto LAB_004f2311;
          }
          else {
LAB_004f2311:
            iVar5 = bid_keyword_list((char *)pbVar13,sVar9,0,iVar3);
          }
          if (iVar5 < 0) {
LAB_004f2359:
            bVar16 = false;
          }
          else {
            if (local_44 == 1) {
              local_44 = 1;
              if ((iVar3 == 0) && (iVar5 != 0)) goto LAB_004f2359;
            }
            else if ((local_44 == 0) && (local_44 = 1, iVar3 == 0)) {
              local_44 = -(uint)(iVar5 != 0);
            }
            if ((iVar3 == 0) && (b[~uVar14 + len] == 0x5c)) {
              bVar16 = true;
              local_5c = 1;
            }
            else {
              iVar3 = (int)local_50;
              local_50 = (ulong)(iVar3 + 1);
              bVar16 = iVar3 < 2;
            }
          }
          if (!bVar16) goto LAB_004f23a7;
        }
        else {
          if (bVar1 == 0x23) goto LAB_004f20a5;
          if (bVar1 != 0x2f) goto LAB_004f2161;
          iVar3 = strncmp((char *)b,"/set",4);
          if (iVar3 == 0) {
            pbVar13 = b + 4;
            lVar8 = len - 4;
            iVar3 = 0;
          }
          else {
            iVar3 = strncmp((char *)b,"/unset",6);
            if (iVar3 != 0) goto LAB_004f23a7;
            pbVar13 = b + 6;
            lVar8 = len - 6;
            iVar3 = 1;
          }
          iVar3 = bid_keyword_list((char *)pbVar13,lVar8,iVar3,0);
          if (iVar3 < 1) goto LAB_004f23a7;
          if (b[~uVar14 + len] == 0x5c) {
            local_5c = 2;
          }
        }
        b = b + len;
        local_58 = local_58 - len;
        goto LAB_004f1f31;
      }
      iVar3 = bid_keyword_list((char *)b,len,0,0);
      if (iVar3 < 1) goto LAB_004f23a7;
      b = b + len;
      if ((b[~uVar14] != 0x5c) && (bVar16 = local_5c == 1, local_5c = 0, bVar16)) {
        iVar3 = (int)local_50;
        uVar4 = iVar3 + 1;
        local_50 = (ulong)uVar4;
        local_5c = 0;
        if (1 < iVar3) goto LAB_004f23ac;
      }
      local_58 = local_58 - len;
      goto LAB_004f1f31;
    }
LAB_004f23a7:
    uVar4 = (uint)local_50;
LAB_004f23ac:
    if ((int)uVar4 < 3) {
      if (len != 0) {
        return 0;
      }
      if ((int)uVar4 < 1) {
        return 0;
      }
    }
    iVar3 = 0x20;
    if ((local_38 != (int *)0x0) && (local_44 == 1)) {
      *local_38 = 1;
    }
  }
  return iVar3;
}

Assistant:

static int
detect_form(struct archive_read *a, int *is_form_d)
{
	const char *p;
	ssize_t avail, ravail;
	ssize_t detected_bytes = 0, len, nl;
	int entry_cnt = 0, multiline = 0;
	int form_D = 0;/* The archive is generated by `NetBSD mtree -D'
			* (In this source we call it `form D') . */

	if (is_form_d != NULL)
		*is_form_d = 0;
	p = __archive_read_ahead(a, 1, &avail);
	if (p == NULL)
		return (-1);
	ravail = avail;
	for (;;) {
		len = next_line(a, &p, &avail, &ravail, &nl);
		/* The terminal character of the line should be
		 * a new line character, '\r\n' or '\n'. */
		if (len <= 0 || nl == 0)
			break;
		if (!multiline) {
			/* Leading whitespace is never significant,
			 * ignore it. */
			while (len > 0 && (*p == ' ' || *p == '\t')) {
				++p;
				--avail;
				--len;
			}
			/* Skip comment or empty line. */ 
			if (p[0] == '#' || p[0] == '\n' || p[0] == '\r') {
				p += len;
				avail -= len;
				continue;
			}
		} else {
			/* A continuance line; the terminal
			 * character of previous line was '\' character. */
			if (bid_keyword_list(p, len, 0, 0) <= 0)
				break;
			if (multiline == 1)
				detected_bytes += len;
			if (p[len-nl-1] != '\\') {
				if (multiline == 1 &&
				    ++entry_cnt >= MAX_BID_ENTRY)
					break;
				multiline = 0;
			}
			p += len;
			avail -= len;
			continue;
		}
		if (p[0] != '/') {
			int last_is_path, keywords;

			keywords = bid_entry(p, len, nl, &last_is_path);
			if (keywords >= 0) {
				detected_bytes += len;
				if (form_D == 0) {
					if (last_is_path)
						form_D = 1;
					else if (keywords > 0)
						/* This line is not `form D'. */
						form_D = -1;
				} else if (form_D == 1) {
					if (!last_is_path && keywords > 0)
						/* This this is not `form D'
						 * and We cannot accept mixed
						 * format. */
						break;
				}
				if (!last_is_path && p[len-nl-1] == '\\')
					/* This line continues. */
					multiline = 1;
				else {
					/* We've got plenty of correct lines
					 * to assume that this file is a mtree
					 * format. */
					if (++entry_cnt >= MAX_BID_ENTRY)
						break;
				}
			} else
				break;
		} else if (strncmp(p, "/set", 4) == 0) {
			if (bid_keyword_list(p+4, len-4, 0, 0) <= 0)
				break;
			/* This line continues. */
			if (p[len-nl-1] == '\\')
				multiline = 2;
		} else if (strncmp(p, "/unset", 6) == 0) {
			if (bid_keyword_list(p+6, len-6, 1, 0) <= 0)
				break;
			/* This line continues. */
			if (p[len-nl-1] == '\\')
				multiline = 2;
		} else
			break;

		/* Test next line. */
		p += len;
		avail -= len;
	}
	if (entry_cnt >= MAX_BID_ENTRY || (entry_cnt > 0 && len == 0)) {
		if (is_form_d != NULL) {
			if (form_D == 1)
				*is_form_d = 1;
		}
		return (32);
	}

	return (0);
}